

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

void __thiscall Clasp::ClaspFacade::SolveStrategy::Async::doStart(Async *this)

{
  id iVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  E local_2c;
  Async *local_28;
  thread local_20;
  
  (*((this->super_SolveStrategy).algo_)->_vptr_SolveAlgorithm[4])();
  local_40._M_device = (mutex_type *)startAlgo;
  local_40._8_8_ = 0;
  local_2c = Async;
  local_28 = this;
  std::thread::
  thread<std::mem_fun1_t<void,Clasp::ClaspFacade::SolveStrategy,Clasp::SolveMode_t>,Clasp::ClaspFacade::SolveStrategy::Async*,Clasp::SolveMode_t::E,void>
            (&local_20,
             (mem_fun1_t<void,_Clasp::ClaspFacade::SolveStrategy,_Clasp::SolveMode_t> *)&local_40,
             &local_28,&local_2c);
  iVar1._M_thread = (this->task_)._M_id._M_thread;
  (this->task_)._M_id._M_thread = (native_handle_type)local_20._M_id._M_thread;
  local_20._M_id._M_thread = (id)(id)iVar1._M_thread;
  if (iVar1._M_thread == 0) {
    local_40._M_device = &this->mqMutex_;
    local_40._8_8_ = local_40._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    if ((this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i == 0) {
      do {
        std::condition_variable::wait((unique_lock *)&this->mqCond_);
      } while ((this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i == 0);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    return;
  }
  std::terminate();
}

Assistant:

virtual void doStart() {
		algo_->enableInterrupts();
		Clasp::mt::thread(std::mem_fun(&SolveStrategy::startAlgo), this, SolveMode_t::Async).swap(task_);
		for (mt::unique_lock<Clasp::mt::mutex> lock(mqMutex_); state_ == 0u;) {
			mqCond_.wait(lock);
		}
	}